

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offline-ekf-flexibility-estimation.hxx
# Opt level: O3

IndexedMatrixArray *
stateObservation::examples::offlineEKFFlexibilityEstimation
          (IndexedMatrixArray *y,IndexedMatrixArray *u,Matrix *xh0,uint numberOfContacts,
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *contactsPositions,double dt,IndexedMatrixArray *ino,IndexedMatrixArray *premea)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  IndexedMatrixArray *pIVar3;
  uint uVar4;
  reference pMVar5;
  long lVar6;
  DenseStorage<double,__1,__1,__1,_0> *pDVar7;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *other;
  undefined4 in_register_0000000c;
  double *pdVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  undefined1 auVar19 [16];
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined8 uVar23;
  uint *in_stack_00000010;
  Matrix Q;
  Matrix R;
  FixedContactEKFFlexEstimatorIMU estimator;
  assign_op<double,_double> local_641;
  IndexedMatrixArray *local_640;
  void *local_638 [2];
  IndexedMatrixArray *local_628;
  Matrix *local_620;
  Matrix<double,__1,__1,_0,__1,__1> local_618;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_600;
  _Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
  *local_5d8;
  _Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
  *local_5d0;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *local_5c8;
  IndexedMatrixArray *local_5c0;
  IndexedMatrixArray *local_5b8;
  _Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
  *local_5b0;
  _Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
  *local_5a8;
  Matrix<double,__1,__1,_0,__1,__1> local_5a0;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  FixedContactEKFFlexEstimatorIMU local_568 [1336];
  
  local_628 = u;
  local_620 = xh0;
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
  FixedContactEKFFlexEstimatorIMU(local_568,0.005);
  stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getEKF();
  stateObservation::KalmanFilterBase::getRmatrixIdentity();
  if ((local_5a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols |
      local_5a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows) <
      0) {
LAB_00105092:
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1>]"
                 );
  }
  local_600.m_rhs.m_rows.m_value =
       local_5a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  local_600.m_rhs.m_cols.m_value =
       local_5a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  local_600.m_rhs.m_functor.m_other = 1e-16;
  local_600.m_lhs = &local_5a0;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,Eigen::internal::assign_op<double,double>>
            (&local_5a0,&local_600,(assign_op<double,_double> *)&local_618);
  stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getEKF();
  stateObservation::KalmanFilterBase::getQmatrixIdentity();
  if ((local_618.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols |
      local_618.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows) <
      0) goto LAB_00105092;
  local_600.m_rhs.m_rows.m_value =
       local_618.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  local_600.m_rhs.m_cols.m_value =
       local_618.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  local_600.m_rhs.m_functor.m_other = 0.0001;
  local_600.m_lhs = &local_618;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,Eigen::internal::assign_op<double,double>>
            (&local_618,&local_600,(assign_op<double,_double> *)local_638);
  auVar2 = _DAT_00108040;
  auVar19 = _DAT_00108030;
  if ((local_618.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows <
       9) || (local_618.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols < 9)) {
LAB_00105073:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                 );
  }
  pdVar8 = local_618.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data + local_618.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows * 6 + 7;
  lVar13 = 0;
  lVar15 = 0;
  do {
    lVar17 = 0;
    auVar22 = auVar19;
    do {
      auVar21 = auVar22 ^ auVar2;
      bVar20 = auVar21._4_4_ == -0x80000000 && auVar21._0_4_ < -0x7ffffffd;
      if (bVar20) {
        uVar23 = 0x3f847ae147ae147b;
        if (lVar13 != lVar17) {
          uVar23 = 0;
        }
        *(undefined8 *)((long)pdVar8 + lVar17 + -8) = uVar23;
      }
      if (bVar20) {
        uVar23 = 0x3f847ae147ae147b;
        if (lVar13 + -8 != lVar17) {
          uVar23 = 0;
        }
        *(undefined8 *)((long)pdVar8 + lVar17) = uVar23;
      }
      auVar21 = _DAT_00108030;
      lVar14 = auVar22._8_8_;
      auVar22._0_8_ = auVar22._0_8_ + 2;
      auVar22._8_8_ = lVar14 + 2;
      lVar17 = lVar17 + 0x10;
    } while (lVar17 != 0x20);
    lVar15 = lVar15 + 1;
    lVar13 = lVar13 + 8;
    pdVar8 = pdVar8 + local_618.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows;
  } while (lVar15 != 3);
  if ((local_618.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows <
       0x12) ||
     (local_618.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols <
      0x12)) goto LAB_00105073;
  pdVar8 = local_618.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data + local_618.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows * 0xf + 0x10;
  lVar13 = 0;
  lVar15 = 0;
  do {
    lVar17 = 0;
    auVar19 = auVar21;
    do {
      auVar22 = auVar19 ^ auVar2;
      bVar20 = auVar22._4_4_ == -0x80000000 && auVar22._0_4_ < -0x7ffffffd;
      if (bVar20) {
        uVar23 = 0x3f847ae147ae147b;
        if (lVar13 != lVar17) {
          uVar23 = 0;
        }
        *(undefined8 *)((long)pdVar8 + lVar17 + -8) = uVar23;
      }
      if (bVar20) {
        uVar23 = 0x3f847ae147ae147b;
        if (lVar13 + -8 != lVar17) {
          uVar23 = 0;
        }
        *(undefined8 *)((long)pdVar8 + lVar17) = uVar23;
      }
      lVar14 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 2;
      auVar19._8_8_ = lVar14 + 2;
      lVar17 = lVar17 + 0x10;
    } while (lVar17 != 0x20);
    lVar15 = lVar15 + 1;
    lVar13 = lVar13 + 8;
    pdVar8 = pdVar8 + local_618.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows;
  } while (lVar15 != 3);
  stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::setFlexibilityCovariance
            ((Matrix *)local_568);
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
  setMeasurementNoiseCovariance((Matrix *)local_568);
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
  setProcessNoiseCovariance((Matrix *)local_568);
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::setContactsNumber
            ((uint)local_568);
  local_640 = y;
  if ((int)contactsPositions != 0) {
    lVar13 = 0;
    iVar18 = 0;
    do {
      local_578 = *(undefined8 *)(*(long *)ino + 0x10 + lVar13);
      puVar1 = (undefined8 *)(*(long *)ino + lVar13);
      local_588 = *puVar1;
      uStack_580 = puVar1[1];
      stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::setContactPosition
                (local_568,iVar18,&local_588);
      iVar18 = iVar18 + 1;
      lVar13 = lVar13 + 0x18;
    } while (((ulong)contactsPositions & 0xffffffff) * 0x18 != lVar13);
  }
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::setFlexibilityGuess
            ((Matrix *)local_568);
  pIVar3 = local_640;
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(local_640);
  uVar4 = 0xffffffff;
  if ((*(long *)(local_628 + 0x38) - *(long *)(local_628 + 0x40) >> 3) * -0x5555555555555555 +
      ((*(long *)(local_628 + 0x50) - *(long *)(local_628 + 0x30) >> 3) + -1 +
      (ulong)(*(long *)(local_628 + 0x50) == 0)) * 0x15 !=
      (*(long *)(local_628 + 0x28) - *(long *)(local_628 + 0x18) >> 3) * 0x5555555555555555) {
    uVar4 = *(uint *)local_628 - 1;
  }
  lVar15 = (*(long *)(pIVar3 + 0x38) - *(long *)(pIVar3 + 0x40) >> 3) * -0x5555555555555555 +
           ((*(long *)(pIVar3 + 0x50) - *(long *)(pIVar3 + 0x30) >> 3) + -1 +
           (ulong)(*(long *)(pIVar3 + 0x50) == 0)) * 0x15;
  lVar13 = *(long *)(pIVar3 + 0x28) - *(long *)(pIVar3 + 0x18) >> 3;
  lVar17 = lVar13 * -0x5555555555555555 + lVar15;
  if (lVar17 != 0) {
    uVar9 = *(uint *)pIVar3;
    uVar12 = lVar17 + (ulong)uVar9;
    if ((uVar9 <= uVar4) && (uVar4 < uVar12)) {
      pMVar5 = std::
               _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
               ::operator[]((_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
                             *)(pIVar3 + 0x18),(ulong)(uVar4 - uVar9));
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                (pMVar5,(Matrix<double,__1,__1,_0,__1,__1> *)
                        CONCAT44(in_register_0000000c,numberOfContacts),
                 (assign_op<double,_double> *)&local_600);
      goto LAB_00104ae3;
    }
    if (uVar12 != uVar4) {
LAB_00105054:
      __assert_fail("(v_.size()==0 || k_+v_.size() == time )&& \"Error: New time instants must be consecutive to existing ones\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/tools/definitions.hxx"
                    ,0xaa,
                    "void stateObservation::IndexedMatrixArray::checkNext_(unsigned int) const");
    }
  }
  if (lVar15 == lVar13 * 0x5555555555555555) {
    *(uint *)pIVar3 = uVar4;
  }
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::push_back((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               *)(pIVar3 + 8),
              (Matrix<double,__1,__1,_0,__1,__1> *)CONCAT44(in_register_0000000c,numberOfContacts));
LAB_00104ae3:
  lVar13 = *(long *)(local_628 + 0x50);
  lVar15 = *(long *)(local_628 + 0x30);
  local_5a8 = (_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
               *)(local_628 + 0x18);
  lVar17 = *(long *)(local_628 + 0x38);
  lVar14 = *(long *)(local_628 + 0x40);
  lVar6 = *(long *)(local_628 + 0x28);
  lVar16 = *(long *)(local_628 + 0x18);
  uVar4 = *(uint *)local_628;
  uVar12 = (ulong)uVar4;
  if ((lVar17 - lVar14 >> 3) * -0x5555555555555555 +
      ((lVar13 - lVar15 >> 3) + -1 + (ulong)(lVar13 == 0)) * 0x15 ==
      (lVar6 - lVar16 >> 3) * 0x5555555555555555) {
    uVar12 = 0;
  }
  local_5b0 = (_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
               *)(local_620 + 1);
  local_5b8 = pIVar3 + 8;
  local_5d0 = (_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
               *)(premea + 0x18);
  local_5c0 = premea + 8;
  local_5d8 = (_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
               *)(in_stack_00000010 + 6);
  local_5c8 = (deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               *)(in_stack_00000010 + 2);
  while( true ) {
    lVar13 = (lVar6 - lVar16 >> 3) * -0x5555555555555555 +
             (lVar17 - lVar14 >> 3) * -0x5555555555555555 +
             ((lVar13 - lVar15 >> 3) + -1 + (ulong)(lVar13 == 0)) * 0x15;
    uVar9 = (uVar4 - 1) + (int)lVar13;
    if (lVar13 == 0) {
      uVar9 = 0;
    }
    uVar11 = (uint)uVar12;
    if (uVar9 < uVar11) {
      free(local_618.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      free(local_5a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
      ~FixedContactEKFFlexEstimatorIMU(local_568);
      return local_640;
    }
    if (((lVar13 == 0) || (uVar11 < uVar4)) || (lVar13 + (ulong)uVar4 <= uVar12)) break;
    pDVar7 = (DenseStorage<double,__1,__1,__1,_0> *)
             std::
             _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
             ::operator[](local_5a8,(ulong)(uVar11 - uVar4));
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,__1,_0> *)&local_600,pDVar7);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_638,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_600);
    stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::setMeasurement
              ((Matrix *)local_568);
    free(local_638[0]);
    free(local_600.m_lhs);
    lVar13 = local_620[3].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
             .m_rows;
    lVar13 = (local_620[1].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols -
              (long)local_620[1].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data >> 3) * -0x5555555555555555 +
             (local_620[2].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_rows -
              local_620[2].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols >> 3) * -0x5555555555555555 +
             ((lVar13 - (long)local_620[2].
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_data >> 3) + -1 + (ulong)(lVar13 == 0)) * 0x15;
    if (lVar13 == 0) break;
    uVar4 = *(uint *)&(local_620->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_data;
    if ((uVar11 < uVar4) || (lVar13 + (ulong)uVar4 <= uVar12)) break;
    pDVar7 = (DenseStorage<double,__1,__1,__1,_0> *)
             std::
             _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
             ::operator[](local_5b0,(ulong)(uVar11 - uVar4));
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,__1,_0> *)&local_600,pDVar7);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_638,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_600);
    stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::setMeasurementInput
              ((Matrix *)local_568);
    free(local_638[0]);
    free(local_600.m_lhs);
    other = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
            stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
            getFlexibilityVector();
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_600,other);
    if ((*(long *)(local_640 + 0x38) - *(long *)(local_640 + 0x40) >> 3) * -0x5555555555555555 +
        ((*(long *)(local_640 + 0x50) - *(long *)(local_640 + 0x30) >> 3) + -1 +
        (ulong)(*(long *)(local_640 + 0x50) == 0)) * 0x15 ==
        (*(long *)(local_640 + 0x28) - *(long *)(local_640 + 0x18) >> 3) * 0x5555555555555555) {
      *(undefined4 *)local_640 = 0;
    }
    std::
    deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::push_back((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 *)local_5b8,(value_type *)&local_600);
    free(local_600.m_lhs);
    if (premea != (IndexedMatrixArray *)0x0) {
      stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getInovation();
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_600,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_638);
      lVar15 = (*(long *)(premea + 0x38) - *(long *)(premea + 0x40) >> 3) * -0x5555555555555555 +
               ((*(long *)(premea + 0x50) - *(long *)(premea + 0x30) >> 3) + -1 +
               (ulong)(*(long *)(premea + 0x50) == 0)) * 0x15;
      lVar13 = *(long *)(premea + 0x28) - *(long *)(premea + 0x18) >> 3;
      lVar17 = lVar13 * -0x5555555555555555 + lVar15;
      if (lVar17 == 0) {
LAB_00104e9a:
        if (lVar15 == lVar13 * 0x5555555555555555) {
          *(uint *)premea = uVar11;
        }
        std::
        deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
        ::push_back((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     *)local_5c0,(value_type *)&local_600);
      }
      else {
        uVar4 = *(uint *)premea;
        uVar10 = lVar17 + (ulong)uVar4;
        if ((uVar11 < uVar4) || (uVar10 <= uVar12)) {
          if (uVar10 == uVar12) goto LAB_00104e9a;
          goto LAB_00105054;
        }
        pMVar5 = std::
                 _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
                 ::operator[](local_5d0,(ulong)(uVar11 - uVar4));
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                  (pMVar5,(Matrix<double,__1,__1,_0,__1,__1> *)&local_600,&local_641);
      }
      free(local_600.m_lhs);
      free(local_638[0]);
    }
    if (in_stack_00000010 != (uint *)0x0) {
      stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getPredictedMeasurement
                ();
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_600,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_638);
      lVar15 = (*(long *)(in_stack_00000010 + 0xe) - *(long *)(in_stack_00000010 + 0x10) >> 3) *
               -0x5555555555555555 +
               ((*(long *)(in_stack_00000010 + 0x14) - *(long *)(in_stack_00000010 + 0xc) >> 3) + -1
               + (ulong)(*(long *)(in_stack_00000010 + 0x14) == 0)) * 0x15;
      lVar13 = *(long *)(in_stack_00000010 + 10) - *(long *)(in_stack_00000010 + 6) >> 3;
      lVar17 = lVar13 * -0x5555555555555555 + lVar15;
      if (lVar17 == 0) {
LAB_00104f93:
        if (lVar15 == lVar13 * 0x5555555555555555) {
          *in_stack_00000010 = uVar11;
        }
        std::
        deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
        ::push_back(local_5c8,(value_type *)&local_600);
      }
      else {
        uVar4 = *in_stack_00000010;
        uVar10 = lVar17 + (ulong)uVar4;
        if ((uVar11 < uVar4) || (uVar10 <= uVar12)) {
          if (uVar10 == uVar12) goto LAB_00104f93;
          goto LAB_00105054;
        }
        pMVar5 = std::
                 _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
                 ::operator[](local_5d8,(ulong)(uVar11 - uVar4));
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                  (pMVar5,(Matrix<double,__1,__1,_0,__1,__1> *)&local_600,&local_641);
      }
      free(local_600.m_lhs);
      free(local_638[0]);
    }
    uVar12 = (ulong)(uVar11 + 1);
    lVar13 = *(long *)(local_628 + 0x50);
    lVar15 = *(long *)(local_628 + 0x30);
    lVar17 = *(long *)(local_628 + 0x38);
    lVar14 = *(long *)(local_628 + 0x40);
    lVar6 = *(long *)(local_628 + 0x28);
    lVar16 = *(long *)(local_628 + 0x18);
    uVar4 = *(uint *)local_628;
  }
  __assert_fail("checkIndex(time) && \"Error: Time out of range\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/tools/definitions.hxx"
                ,0x9b,"void stateObservation::IndexedMatrixArray::check_(unsigned int) const");
}

Assistant:

stateObservation::IndexedMatrixArray offlineEKFFlexibilityEstimation(
            const stateObservation::IndexedMatrixArray & y,
            const stateObservation::IndexedMatrixArray & u,
            const Matrix & xh0,
            unsigned numberOfContacts,
            const std::vector<Vector3,Eigen::aligned_allocator<Vector3> > & contactsPositions,
            double dt,
            IndexedMatrixArray * ino,
            IndexedMatrixArray * premea)
{

    (void)dt;
        ///Sizes of the states for the state, the measurement, and the input vector

    flexibilityEstimation::FixedContactEKFFlexEstimatorIMU estimator;


    Matrix R(estimator.getEKF().getRmatrixIdentity());
    R=R*1.e-16;

    Matrix Q(estimator.getEKF().getQmatrixIdentity());
    Q=Q*1.e-4;
    Q.block(6,6,3,3)=Matrix3::Identity()*1.e-2;
    Q.block(15,15,3,3)=Matrix3::Identity()*1.e-2;


    estimator.setFlexibilityCovariance(Q);
    estimator.setMeasurementNoiseCovariance(R);
    estimator.setProcessNoiseCovariance(Q);


    estimator.setContactsNumber(numberOfContacts);

    for (unsigned i = 0; i<numberOfContacts ; ++i)
    {
        estimator.setContactPosition(i,contactsPositions[i]);
    }

    ///
    estimator.setFlexibilityGuess(xh0);

    ///the array of the state estimations over time
    stateObservation::IndexedMatrixArray xh;
    xh.setValue(xh0,y.getFirstIndex()-1);

    ///the reconstruction of the state
    for (unsigned i=y.getFirstIndex();i<=y.getLastIndex();++i)
    {
        //std::cout << i << std::endl;

        ///introduction of the measurement
        estimator.setMeasurement(y[i]);

        estimator.setMeasurementInput(u[i]);

        ///get the estimation and give it to the array
        xh.pushBack(estimator.getFlexibilityVector());

        if (ino != 0)
        {
            ino->setValue(estimator.getInovation(),i);
        }

        if (premea != 0)
        {
            premea->setValue(estimator.getPredictedMeasurement(),i);
        }

    }

    return xh;
}